

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O3

void ncnn::qsort_descent_inplace<ncnn::BBoxRect>
               (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *datas,
               vector<float,_std::allocator<float>_> *scores,int left,int right)

{
  float fVar1;
  float fVar2;
  int iVar3;
  pointer pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  pointer pfVar10;
  int right_00;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  pfVar10 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    right_00 = right;
    iVar11 = left;
    if (left <= right) {
      fVar1 = pfVar10[(left + right) / 2];
      do {
        lVar13 = (long)iVar11 + -1;
        lVar15 = (long)iVar11 * 5 + -5;
        iVar3 = iVar11;
        do {
          iVar11 = iVar3;
          lVar12 = lVar15;
          lVar9 = lVar13 + 1;
          lVar13 = lVar13 + 1;
          lVar15 = lVar12 + 5;
          iVar3 = iVar11 + 1;
        } while (fVar1 < pfVar10[lVar9]);
        lVar15 = (long)right_00 + 1;
        lVar9 = (long)right_00 * 5 + 5;
        iVar3 = right_00;
        do {
          right_00 = iVar3;
          lVar14 = lVar9;
          lVar8 = lVar15 + -1;
          lVar15 = lVar15 + -1;
          lVar9 = lVar14 + -5;
          iVar3 = right_00 + -1;
        } while (pfVar10[lVar8] <= fVar1 && fVar1 != pfVar10[lVar8]);
        if (lVar13 <= lVar15) {
          pBVar4 = (datas->super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          iVar3 = (&pBVar4[1].label)[lVar12];
          uVar5 = *(undefined8 *)(&pBVar4[1].xmin + lVar12);
          uVar6 = *(undefined8 *)(&pBVar4[1].xmin + lVar12 + 2);
          (&pBVar4[1].label)[lVar12] = (&pBVar4[-1].label)[lVar14];
          uVar7 = *(undefined8 *)(&pBVar4[-1].xmin + lVar14 + 2);
          *(undefined8 *)(&pBVar4[1].xmin + lVar12) = *(undefined8 *)(&pBVar4[-1].xmin + lVar14);
          *(undefined8 *)(&pBVar4[1].xmin + lVar12 + 2) = uVar7;
          (&pBVar4[-1].label)[lVar14] = iVar3;
          *(undefined8 *)(&pBVar4[-1].xmin + lVar14) = uVar5;
          *(undefined8 *)(&pBVar4[-1].xmin + lVar14 + 2) = uVar6;
          pfVar10 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          fVar2 = pfVar10[lVar13];
          pfVar10[lVar13] = pfVar10[lVar15];
          pfVar10[lVar15] = fVar2;
          right_00 = right_00 + -1;
          iVar11 = iVar11 + 1;
        }
      } while (iVar11 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace<ncnn::BBoxRect>(datas,scores,left,right_00);
      pfVar10 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    left = iVar11;
  } while (iVar11 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<T>& datas, std::vector<float>& scores, int left, int right)
{
    int i = left;
    int j = right;
    float p = scores[(left + right) / 2];

    while (i <= j)
    {
        while (scores[i] > p)
            i++;

        while (scores[j] < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(datas[i], datas[j]);
            std::swap(scores[i], scores[j]);

            i++;
            j--;
        }
    }

    if (left < j)
        qsort_descent_inplace(datas, scores, left, j);

    if (i < right)
        qsort_descent_inplace(datas, scores, i, right);
}